

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O3

UBool __thiscall icu_63::StringTrieBuilder::ValueNode::operator==(ValueNode *this,Node *other)

{
  UBool UVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this != (ValueNode *)other) {
    UVar1 = Node::operator==(&this->super_Node,other);
    if ((UVar1 == '\0') || (this->hasValue != *(char *)&other[1].super_UObject._vptr_UObject)) {
      bVar2 = false;
    }
    else if (this->hasValue != '\0') {
      bVar2 = this->value == *(int *)((long)&other[1].super_UObject._vptr_UObject + 4);
    }
  }
  return bVar2;
}

Assistant:

UBool
StringTrieBuilder::ValueNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const ValueNode &o=(const ValueNode &)other;
    return hasValue==o.hasValue && (!hasValue || value==o.value);
}